

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

int xz_decomp(xz_statep state)

{
  int iVar1;
  uLong uVar2;
  bool local_3d;
  undefined4 local_3c;
  lzma_action action;
  lzma_stream *strm;
  unsigned_long len;
  unsigned_long crc;
  uint had;
  int ret;
  xz_statep state_local;
  
  local_3c = 0;
  crc._0_4_ = (int)(state->strm).avail_out;
  _had = state;
  do {
    if (((state->strm).avail_in == 0) && (iVar1 = xz_avail(_had), iVar1 == -1)) {
      return -1;
    }
    if ((state->strm).avail_in == 0) {
      xz_error(_had,9,"unexpected end of file");
      return -1;
    }
    if (_had->eof != 0) {
      local_3c = 3;
    }
    if (_had->how == 2) {
      (_had->zstrm).avail_in = (uInt)(_had->strm).avail_in;
      (_had->zstrm).next_in = (_had->strm).next_in;
      (_had->zstrm).avail_out = (uInt)(_had->strm).avail_out;
      (_had->zstrm).next_out = (_had->strm).next_out;
      crc._4_4_ = inflate(&_had->zstrm,0);
      if ((crc._4_4_ == -2) || (crc._4_4_ == 2)) {
        xz_error(_had,-2,"internal error: inflate stream corrupt");
        return -1;
      }
      if (crc._4_4_ == -4) {
        crc._4_4_ = 5;
      }
      if (crc._4_4_ == -3) {
        crc._4_4_ = 9;
      }
      if (crc._4_4_ == 1) {
        crc._4_4_ = 1;
      }
      (_had->strm).avail_in = (ulong)(_had->zstrm).avail_in;
      (_had->strm).next_in = (_had->zstrm).next_in;
      (_had->strm).avail_out = (ulong)(_had->zstrm).avail_out;
      (_had->strm).next_out = (_had->zstrm).next_out;
    }
    else {
      crc._4_4_ = lzma_code(&state->strm,local_3c);
    }
    if (crc._4_4_ == 5) {
      xz_error(_had,5,"out of memory");
      return -1;
    }
    if (crc._4_4_ == 9) {
      xz_error(_had,9,"compressed data error");
      return -1;
    }
    if (crc._4_4_ == 0xb) {
      xz_error(_had,0xb,"compression error");
      return -1;
    }
    if (((_had->how != 2) && (crc._4_4_ != 0)) && (crc._4_4_ != 1)) {
      xz_error(_had,crc._4_4_,"lzma error");
      return -1;
    }
    local_3d = (state->strm).avail_out != 0 && crc._4_4_ != 1;
  } while (local_3d);
  _had->have = (int)crc - (int)(state->strm).avail_out;
  _had->next = (state->strm).next_out + -(ulong)_had->have;
  uVar2 = crc32((_had->zstrm).adler,_had->next,_had->have);
  (_had->zstrm).adler = uVar2;
  if (crc._4_4_ == 1) {
    if (_had->how == 2) {
      iVar1 = gz_next4(_had,&len);
      if ((iVar1 == -1) || (iVar1 = gz_next4(_had,(unsigned_long *)&strm), iVar1 == -1)) {
        xz_error(_had,9,"unexpected end of file");
        return -1;
      }
      if (len != (_had->zstrm).adler) {
        xz_error(_had,9,"incorrect data check");
        return -1;
      }
      if (strm != (lzma_stream *)((_had->zstrm).total_out & 0xffffffff)) {
        xz_error(_had,9,"incorrect length check");
        return -1;
      }
      (_had->strm).avail_in = 0;
      (_had->strm).next_in = (uint8_t *)0x0;
      (_had->strm).avail_out = 0;
      (_had->strm).next_out = (uint8_t *)0x0;
    }
    else if (((state->strm).avail_in != 0) || (_had->eof == 0)) {
      xz_error(_had,9,"trailing garbage");
      return -1;
    }
    _had->how = 0;
  }
  return 0;
}

Assistant:

static int
xz_decomp(xz_statep state)
{
    int ret;
    unsigned had;
    unsigned long crc, len;
    lzma_stream *strm = &(state->strm);

    lzma_action action = LZMA_RUN;

    /* Avoid unused variable warning if features are disabled. */
    (void) crc;
    (void) len;

    /* fill output buffer up to end of deflate stream */
    had = strm->avail_out;
    do {
        /* get more input for inflate() */
        if (strm->avail_in == 0 && xz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0) {
            xz_error(state, LZMA_DATA_ERROR, "unexpected end of file");
            return -1;
        }
        if (state->eof)
            action = LZMA_FINISH;

        /* decompress and handle errors */
#ifdef LIBXML_ZLIB_ENABLED
        if (state->how == GZIP) {
            state->zstrm.avail_in = (uInt) state->strm.avail_in;
            state->zstrm.next_in = (Bytef *) state->strm.next_in;
            state->zstrm.avail_out = (uInt) state->strm.avail_out;
            state->zstrm.next_out = (Bytef *) state->strm.next_out;
            ret = inflate(&state->zstrm, Z_NO_FLUSH);
            if (ret == Z_STREAM_ERROR || ret == Z_NEED_DICT) {
                xz_error(state, Z_STREAM_ERROR,
                         "internal error: inflate stream corrupt");
                return -1;
            }
            /*
             * FIXME: Remapping a couple of error codes and falling through
             * to the LZMA error handling looks fragile.
             */
            if (ret == Z_MEM_ERROR)
                ret = LZMA_MEM_ERROR;
            if (ret == Z_DATA_ERROR)
                ret = LZMA_DATA_ERROR;
            if (ret == Z_STREAM_END)
                ret = LZMA_STREAM_END;
            state->strm.avail_in = state->zstrm.avail_in;
            state->strm.next_in = state->zstrm.next_in;
            state->strm.avail_out = state->zstrm.avail_out;
            state->strm.next_out = state->zstrm.next_out;
        } else                  /* state->how == LZMA */
#endif
            ret = lzma_code(strm, action);
        if (ret == LZMA_MEM_ERROR) {
            xz_error(state, LZMA_MEM_ERROR, "out of memory");
            return -1;
        }
        if (ret == LZMA_DATA_ERROR) {
            xz_error(state, LZMA_DATA_ERROR, "compressed data error");
            return -1;
        }
        if (ret == LZMA_PROG_ERROR) {
            xz_error(state, LZMA_PROG_ERROR, "compression error");
            return -1;
        }
        if ((state->how != GZIP) &&
            (ret != LZMA_OK) && (ret != LZMA_STREAM_END)) {
            xz_error(state, ret, "lzma error");
            return -1;
        }
    } while (strm->avail_out && ret != LZMA_STREAM_END);

    /* update available output and crc check value */
    state->have = had - strm->avail_out;
    state->next = strm->next_out - state->have;
#ifdef LIBXML_ZLIB_ENABLED
    state->zstrm.adler =
        crc32(state->zstrm.adler, state->next, state->have);
#endif

    if (ret == LZMA_STREAM_END) {
#ifdef LIBXML_ZLIB_ENABLED
        if (state->how == GZIP) {
            if (gz_next4(state, &crc) == -1 || gz_next4(state, &len) == -1) {
                xz_error(state, LZMA_DATA_ERROR, "unexpected end of file");
                return -1;
            }
            if (crc != state->zstrm.adler) {
                xz_error(state, LZMA_DATA_ERROR, "incorrect data check");
                return -1;
            }
            if (len != (state->zstrm.total_out & 0xffffffffL)) {
                xz_error(state, LZMA_DATA_ERROR, "incorrect length check");
                return -1;
            }
            state->strm.avail_in = 0;
            state->strm.next_in = NULL;
            state->strm.avail_out = 0;
            state->strm.next_out = NULL;
        } else
#endif
        if (strm->avail_in != 0 || !state->eof) {
            xz_error(state, LZMA_DATA_ERROR, "trailing garbage");
            return -1;
        }
        state->how = LOOK;      /* ready for next stream, once have is 0 (leave
                                 * state->direct unchanged to remember how) */
    }

    /* good decompression */
    return 0;
}